

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturemanager.cpp
# Opt level: O2

void __thiscall FTextureManager::AddTexturesForWad(FTextureManager *this,int wadnum)

{
  bool bVar1;
  int lump;
  int iVar2;
  int iVar3;
  uint uVar4;
  FTextureID FVar5;
  int iVar6;
  FTexture *texture;
  FString Name;
  int firsttexture;
  
  firsttexture = (this->Textures).Count;
  FWadCollection::GetNumLumps(&Wads);
  TArray<int,_int>::Push(&this->FirstTextureForFile,&firsttexture);
  AddGroup(this,wadnum,1,3);
  AddGroup(this,wadnum,0xe,4);
  LoadTextureX(this,wadnum);
  AddGroup(this,wadnum,2,2);
  AddGroup(this,wadnum,5,10);
  lump = FWadCollection::GetFirstLump(&Wads,wadnum);
  iVar2 = FWadCollection::GetLastLump(&Wads,wadnum);
  do {
    if (iVar2 < lump) {
      LoadTextureDefs(this,wadnum,"TEXTURES");
      LoadTextureDefs(this,wadnum,"HIRESTEX");
      AddHiresTextures(this,wadnum);
      SortTexturesByType(this,firsttexture,(this->Textures).Count);
      return;
    }
    Name.Chars = FString::NullString.Nothing;
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
    FWadCollection::GetLumpName(&Wads,&Name,lump);
    iVar3 = FWadCollection::GetLumpNamespace(&Wads,lump);
    if (iVar3 == 0xf) {
      iVar6 = FWadCollection::CheckNumForName(&Wads,Name.Chars,0xf);
      iVar3 = 8;
LAB_005a99dd:
      if (lump == iVar6) {
LAB_005a99e3:
        texture = FTexture::CreateTexture(lump,iVar3);
        if (texture != (FTexture *)0x0) {
          AddTexture(this,texture);
        }
      }
    }
    else if (iVar3 == 0) {
      uVar4 = FWadCollection::GetLumpFlags(&Wads,lump);
      if ((((((uVar4 & 2) == 0) &&
            (bVar1 = FWadCollection::CheckLumpName(&Wads,lump,(char *)""), !bVar1)) &&
           (bVar1 = FWadCollection::CheckLumpName(&Wads,lump,"THINGS"), !bVar1)) &&
          ((((bVar1 = FWadCollection::CheckLumpName(&Wads,lump,"LINEDEFS"), !bVar1 &&
             (bVar1 = FWadCollection::CheckLumpName(&Wads,lump,"SIDEDEFS"), !bVar1)) &&
            ((bVar1 = FWadCollection::CheckLumpName(&Wads,lump,"VERTEXES"), !bVar1 &&
             ((bVar1 = FWadCollection::CheckLumpName(&Wads,lump,"SEGS"), !bVar1 &&
              (bVar1 = FWadCollection::CheckLumpName(&Wads,lump,"SSECTORS"), !bVar1)))))) &&
           (bVar1 = FWadCollection::CheckLumpName(&Wads,lump,"NODES"), !bVar1)))) &&
         ((((bVar1 = FWadCollection::CheckLumpName(&Wads,lump,"SECTORS"), !bVar1 &&
            (bVar1 = FWadCollection::CheckLumpName(&Wads,lump,"REJECT"), !bVar1)) &&
           (bVar1 = FWadCollection::CheckLumpName(&Wads,lump,"BLOCKMAP"), !bVar1)) &&
          ((bVar1 = FWadCollection::CheckLumpName(&Wads,lump,"BEHAVIOR"), !bVar1 &&
           (iVar3 = FWadCollection::CheckNumForName(&Wads,Name.Chars,0xf), lump == iVar3)))))) {
        FVar5 = CheckForTexture(this,Name.Chars,4,0);
        iVar3 = 8;
        if (FVar5.texnum < 0) goto LAB_005a99e3;
      }
    }
    else if (0x10 < iVar3) {
      iVar6 = FWadCollection::CheckNumForName(&Wads,Name.Chars,iVar3);
      iVar3 = 0xc;
      goto LAB_005a99dd;
    }
    FString::~FString(&Name);
    lump = lump + 1;
  } while( true );
}

Assistant:

void FTextureManager::AddTexturesForWad(int wadnum)
{
	int firsttexture = Textures.Size();
	int lumpcount = Wads.GetNumLumps();

	FirstTextureForFile.Push(firsttexture);

	// First step: Load sprites
	AddGroup(wadnum, ns_sprites, FTexture::TEX_Sprite);

	// When loading a Zip, all graphics in the patches/ directory should be
	// added as well.
	AddGroup(wadnum, ns_patches, FTexture::TEX_WallPatch);

	// Second step: TEXTUREx lumps
	LoadTextureX(wadnum);

	// Third step: Flats
	AddGroup(wadnum, ns_flats, FTexture::TEX_Flat);

	// Fourth step: Textures (TX_)
	AddGroup(wadnum, ns_newtextures, FTexture::TEX_Override);

	// Sixth step: Try to find any lump in the WAD that may be a texture and load as a TEX_MiscPatch
	int firsttx = Wads.GetFirstLump(wadnum);
	int lasttx = Wads.GetLastLump(wadnum);

	for (int i= firsttx; i <= lasttx; i++)
	{
		bool skin = false;
		FString Name;
		Wads.GetLumpName(Name, i);

		// Ignore anything not in the global namespace
		int ns = Wads.GetLumpNamespace(i);
		if (ns == ns_global)
		{
			// In Zips all graphics must be in a separate namespace.
			if (Wads.GetLumpFlags(i) & LUMPF_ZIPFILE) continue;

			// Ignore lumps with empty names.
			if (Wads.CheckLumpName(i, "")) continue;

			// Ignore anything belonging to a map
			if (Wads.CheckLumpName(i, "THINGS")) continue;
			if (Wads.CheckLumpName(i, "LINEDEFS")) continue;
			if (Wads.CheckLumpName(i, "SIDEDEFS")) continue;
			if (Wads.CheckLumpName(i, "VERTEXES")) continue;
			if (Wads.CheckLumpName(i, "SEGS")) continue;
			if (Wads.CheckLumpName(i, "SSECTORS")) continue;
			if (Wads.CheckLumpName(i, "NODES")) continue;
			if (Wads.CheckLumpName(i, "SECTORS")) continue;
			if (Wads.CheckLumpName(i, "REJECT")) continue;
			if (Wads.CheckLumpName(i, "BLOCKMAP")) continue;
			if (Wads.CheckLumpName(i, "BEHAVIOR")) continue;

			// Don't bother looking at this lump if something later overrides it.
			if (Wads.CheckNumForName(Name, ns_graphics) != i) continue;

			// skip this if it has already been added as a wall patch.
			if (CheckForTexture(Name, FTexture::TEX_WallPatch, 0).Exists()) continue;
		}
		else if (ns == ns_graphics)
		{
			// Don't bother looking this lump if something later overrides it.
			if (Wads.CheckNumForName(Name, ns_graphics) != i) continue;
		}
		else if (ns >= ns_firstskin)
		{
			// Don't bother looking this lump if something later overrides it.
			if (Wads.CheckNumForName(Name, ns) != i) continue;
			skin = true;
		}
		else continue;

		// Try to create a texture from this lump and add it.
		// Unfortunately we have to look at everything that comes through here...
		FTexture *out = FTexture::CreateTexture(i, skin ? FTexture::TEX_SkinGraphic : FTexture::TEX_MiscPatch);

		if (out != NULL) 
		{
			AddTexture (out);
		}
	}

	// Check for text based texture definitions
	LoadTextureDefs(wadnum, "TEXTURES");
	LoadTextureDefs(wadnum, "HIRESTEX");

	// Seventh step: Check for hires replacements.
	AddHiresTextures(wadnum);

	SortTexturesByType(firsttexture, Textures.Size());
}